

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

VkOffset3D vkt::synchronization::anon_unknown_0::CopyBlitImage::makeExtentOffset(Resource *resource)

{
  deUint32 z;
  VkImageType VVar1;
  undefined4 x;
  undefined4 y;
  ImageResource *pIVar2;
  VkOffset3D VVar3;
  undefined8 local_60;
  deInt32 local_58;
  undefined8 local_50;
  deInt32 local_48;
  undefined8 local_40;
  deInt32 local_38;
  deInt32 local_30;
  deInt32 dStack_2c;
  VkExtent3D extent;
  Resource *resource_local;
  undefined4 uStack_10;
  deInt32 local_c;
  
  pIVar2 = Resource::getImage(resource);
  z = (pIVar2->extent).depth;
  x = (pIVar2->extent).width;
  y = (pIVar2->extent).height;
  pIVar2 = Resource::getImage(resource);
  VVar1 = pIVar2->imageType;
  if (VVar1 == VK_IMAGE_TYPE_1D) {
    VVar3 = ::vk::makeOffset3D(x,1,1);
    local_40 = VVar3._0_8_;
    stack0xffffffffffffffec = local_40;
    local_38 = VVar3.z;
    local_c = local_38;
  }
  else if (VVar1 == VK_IMAGE_TYPE_2D) {
    VVar3 = ::vk::makeOffset3D(x,y,1);
    local_50 = VVar3._0_8_;
    stack0xffffffffffffffec = local_50;
    local_48 = VVar3.z;
    local_c = local_48;
  }
  else if (VVar1 == VK_IMAGE_TYPE_3D) {
    VVar3 = ::vk::makeOffset3D(x,y,z);
    local_60 = VVar3._0_8_;
    stack0xffffffffffffffec = local_60;
    local_58 = VVar3.z;
    local_c = local_58;
  }
  else {
    memset((void *)((long)&resource_local + 4),0,0xc);
  }
  VVar3.z = local_c;
  VVar3.x = resource_local._4_4_;
  VVar3.y = uStack_10;
  return VVar3;
}

Assistant:

VkOffset3D makeExtentOffset (const Resource& resource)
{
	DE_ASSERT(resource.getType() == RESOURCE_TYPE_IMAGE);
	const VkExtent3D extent = resource.getImage().extent;

	switch (resource.getImage().imageType)
	{
		case VK_IMAGE_TYPE_1D:	return makeOffset3D(extent.width, 1, 1);
		case VK_IMAGE_TYPE_2D:	return makeOffset3D(extent.width, extent.height, 1);
		case VK_IMAGE_TYPE_3D:	return makeOffset3D(extent.width, extent.height, extent.depth);
		default:
			DE_ASSERT(0);
			return VkOffset3D();
	}
}